

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O0

void __thiscall
CommandLine::addOption<bool&,char,char_const(&)[5],char_const(&)[16]>
          (CommandLine *this,bool *args,char *args_1,char (*args_2) [5],char (*args_3) [16])

{
  CommandLineOption *this_00;
  CommandLineOption *local_38;
  char (*local_30) [16];
  char (*args_local_3) [16];
  char (*args_local_2) [5];
  char *args_local_1;
  bool *args_local;
  CommandLine *this_local;
  
  local_30 = args_3;
  args_local_3 = (char (*) [16])args_2;
  args_local_2 = (char (*) [5])args_1;
  args_local_1 = args;
  args_local = (bool *)this;
  this_00 = (CommandLineOption *)operator_new(0x60);
  CommandLineOption::CommandLineOption<bool>
            (this_00,(bool *)args_local_1,(*args_local_2)[0],*args_local_3,*local_30);
  local_38 = this_00;
  List<CommandLineOption_*>::operator<<(&this->_options,&local_38);
  return;
}

Assistant:

void addOption (Args&&... args)
	{
		_options << new CommandLineOption (args...);
	}